

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsSceneCreator.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::KinematicsSceneCreator::KinematicsSceneCreator
          (KinematicsSceneCreator *this,DocumentProcessor *documentProcessor)

{
  KinematicsIntermediateData *pKVar1;
  DocumentProcessor *in_RSI;
  undefined8 *in_RDI;
  hash_map<COLLADASaxFWL::KinematicsModel_*,_COLLADAFW::KinematicsModel_*>
  *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__KinematicsSceneCreator_00db8310;
  in_RDI[1] = 0;
  in_RDI[2] = in_RSI;
  pKVar1 = DocumentProcessor::getKinematicsIntermediateData(in_RSI);
  in_RDI[3] = pKVar1;
  in_RDI[4] = 0;
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             (in_RDI + 5));
  in_RDI[0xf] = 0;
  std::
  map<COLLADAFW::Joint_*,_unsigned_long,_std::less<COLLADAFW::Joint_*>,_std::allocator<std::pair<COLLADAFW::Joint_*const,_unsigned_long>_>_>
  ::map((map<COLLADAFW::Joint_*,_unsigned_long,_std::less<COLLADAFW::Joint_*>,_std::allocator<std::pair<COLLADAFW::Joint_*const,_unsigned_long>_>_>
         *)0xb002e7);
  std::
  map<COLLADAFW::JointPrimitive_*,_COLLADAFW::JointPrimitive_*,_std::less<COLLADAFW::JointPrimitive_*>,_std::allocator<std::pair<COLLADAFW::JointPrimitive_*const,_COLLADAFW::JointPrimitive_*>_>_>
  ::map((map<COLLADAFW::JointPrimitive_*,_COLLADAFW::JointPrimitive_*,_std::less<COLLADAFW::JointPrimitive_*>,_std::allocator<std::pair<COLLADAFW::JointPrimitive_*const,_COLLADAFW::JointPrimitive_*>_>_>
         *)0xb002fd);
  COLLADABU::hash_map<COLLADASaxFWL::KinematicsModel_*,_COLLADAFW::KinematicsModel_*>::hash_map
            (in_stack_ffffffffffffffe0);
  std::
  set<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding,_std::less<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>,_std::allocator<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>_>
  ::set((set<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding,_std::less<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>,_std::allocator<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>_>
         *)0xb00321);
  return;
}

Assistant:

KinematicsSceneCreator::KinematicsSceneCreator( DocumentProcessor* documentProcessor )
		: mKinematicsScene(0)
		, mDocumentProcessor(documentProcessor)
		, mKinematicsIntermediateData( documentProcessor->getKinematicsIntermediateData())
		, mLargestLinkNumber(0)
		, mLargestJointIndex(0)
	{

	}